

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O2

void lj_str_resize(lua_State *L,MSize newmask)

{
  long *plVar1;
  undefined8 *puVar2;
  long lVar3;
  ulong *puVar4;
  byte bVar5;
  uint uVar6;
  StrHash SVar7;
  void *__s;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong *puVar11;
  uint uVar12;
  GCstr *s;
  undefined8 *puVar13;
  bool bVar14;
  
  if ((newmask < 0x3ffffff) &&
     (puVar2 = (undefined8 *)(L->glref).ptr64, *(char *)((long)puVar2 + 0x21) != '\x03')) {
    lVar3 = puVar2[0x13];
    uVar9 = (ulong)(newmask * 8 + 8);
    __s = lj_mem_realloc(L,(void *)0x0,0,uVar9);
    memset(__s,0,uVar9);
    uVar12 = *(uint *)(puVar2 + 0x14);
    uVar10 = uVar12;
    if (*(char *)((long)puVar2 + 0xad) != '\0') {
      for (; uVar10 != 0xffffffff; uVar10 = uVar10 - 1) {
        for (puVar13 = (undefined8 *)(*(ulong *)(lVar3 + (ulong)uVar10 * 8) & 0xfffffffffffffffe);
            puVar13 != (undefined8 *)0x0; puVar13 = (undefined8 *)*puVar13) {
          if (*(char *)((long)puVar13 + 0xb) == '\0') {
            uVar6 = *(uint *)(puVar13 + 2);
          }
          else {
            uVar6 = hash_sparse(puVar2[0x16],(char *)(puVar13 + 3),*(MSize *)((long)puVar13 + 0x14))
            ;
          }
          plVar1 = (long *)((long)__s + (ulong)(uVar6 & newmask) * 8);
          *plVar1 = *plVar1 + 1;
        }
      }
      bVar5 = 0;
      for (uVar9 = (ulong)newmask; (int)uVar9 != -1; uVar9 = (ulong)((int)uVar9 - 1)) {
        bVar14 = 0x20 < *(ulong *)((long)__s + uVar9 * 8);
        bVar5 = bVar5 | bVar14;
        *(ulong *)((long)__s + uVar9 * 8) = (ulong)bVar14;
      }
      *(byte *)((long)puVar2 + 0xad) = bVar5;
    }
    for (; uVar12 != 0xffffffff; uVar12 = uVar12 - 1) {
      puVar11 = (ulong *)(*(ulong *)(lVar3 + (ulong)uVar12 * 8) & 0xfffffffffffffffe);
      while (puVar11 != (ulong *)0x0) {
        puVar4 = (ulong *)*puVar11;
        uVar10 = (uint)puVar11[2];
        if (*(char *)((long)puVar11 + 0xb) == '\0') {
          uVar8 = (ulong)(uVar10 & newmask);
          uVar9 = *(ulong *)((long)__s + uVar8 * 8);
          if ((uVar9 & 1) != 0) {
            SVar7 = hash_dense(puVar2[0x16],uVar10,(char *)(puVar11 + 3),
                               *(MSize *)((long)puVar11 + 0x14));
            *(StrHash *)(puVar11 + 2) = SVar7;
            *(undefined1 *)((long)puVar11 + 0xb) = 1;
            uVar8 = (ulong)(SVar7 & newmask);
            uVar9 = *(ulong *)((long)__s + uVar8 * 8);
          }
        }
        else {
          SVar7 = hash_sparse(puVar2[0x16],(char *)(puVar11 + 3),*(MSize *)((long)puVar11 + 0x14));
          uVar8 = (ulong)(SVar7 & newmask);
          uVar9 = *(ulong *)((long)__s + uVar8 * 8);
          if ((uVar9 & 1) == 0) {
            *(StrHash *)(puVar11 + 2) = SVar7;
            *(undefined1 *)((long)puVar11 + 0xb) = 0;
          }
          else {
            uVar8 = (ulong)(uVar10 & newmask);
            uVar9 = *(ulong *)((long)__s + uVar8 * 8);
          }
        }
        *puVar11 = uVar9 & 0xfffffffffffffffe;
        *(ulong *)((long)__s + uVar8 * 8) = (ulong)((uint)uVar9 & 1) | (ulong)puVar11;
        puVar11 = puVar4;
      }
    }
    puVar2[2] = puVar2[2] + (ulong)(*(int *)(puVar2 + 0x14) + 1) * -8;
    (*(code *)*puVar2)(puVar2[1],puVar2[0x13],(ulong)(*(int *)(puVar2 + 0x14) + 1) * 8,0);
    puVar2[0x13] = __s;
    *(MSize *)(puVar2 + 0x14) = newmask;
  }
  return;
}

Assistant:

void lj_str_resize(lua_State *L, MSize newmask)
{
  global_State *g = G(L);
  GCRef *newtab, *oldtab = g->str.tab;
  MSize i;

  /* No resizing during GC traversal or if already too big. */
  if (g->gc.state == GCSsweepstring || newmask >= LJ_MAX_STRTAB-1)
    return;

  newtab = lj_mem_newvec(L, newmask+1, GCRef);
  memset(newtab, 0, (newmask+1)*sizeof(GCRef));

#if LUAJIT_SECURITY_STRHASH
  /* Check which chains need secondary hashes. */
  if (g->str.second) {
    int newsecond = 0;
    /* Compute primary chain lengths. */
    for (i = g->str.mask; i != ~(MSize)0; i--) {
      GCobj *o = (GCobj *)(gcrefu(oldtab[i]) & ~(uintptr_t)1);
      while (o) {
	GCstr *s = gco2str(o);
	MSize hash = s->hashalg ? hash_sparse(g->str.seed, strdata(s), s->len) :
				  s->hash;
	hash &= newmask;
	setgcrefp(newtab[hash], gcrefu(newtab[hash]) + 1);
	o = gcnext(o);
      }
    }
    /* Mark secondary chains. */
    for (i = newmask; i != ~(MSize)0; i--) {
      int secondary = gcrefu(newtab[i]) > LJ_STR_MAXCOLL;
      newsecond |= secondary;
      setgcrefp(newtab[i], secondary);
    }
    g->str.second = newsecond;
  }
#endif

  /* Reinsert all strings from the old table into the new table. */
  for (i = g->str.mask; i != ~(MSize)0; i--) {
    GCobj *o = (GCobj *)(gcrefu(oldtab[i]) & ~(uintptr_t)1);
    while (o) {
      GCobj *next = gcnext(o);
      GCstr *s = gco2str(o);
      MSize hash = s->hash;
#if LUAJIT_SECURITY_STRHASH
      uintptr_t u;
      if (LJ_LIKELY(!s->hashalg)) {  /* String hashed with primary hash. */
	hash &= newmask;
	u = gcrefu(newtab[hash]);
	if (LJ_UNLIKELY(u & 1)) {  /* Switch string to secondary hash. */
	  s->hash = hash = hash_dense(g->str.seed, s->hash, strdata(s), s->len);
	  s->hashalg = 1;
	  hash &= newmask;
	  u = gcrefu(newtab[hash]);
	}
      } else {  /* String hashed with secondary hash. */
	MSize shash = hash_sparse(g->str.seed, strdata(s), s->len);
	u = gcrefu(newtab[shash & newmask]);
	if (u & 1) {
	  hash &= newmask;
	  u = gcrefu(newtab[hash]);
	} else {  /* Revert string back to primary hash. */
	  s->hash = shash;
	  s->hashalg = 0;
	  hash = (shash & newmask);
	}
      }
      /* NOBARRIER: The string table is a GC root. */
      setgcrefp(o->gch.nextgc, (u & ~(uintptr_t)1));
      setgcrefp(newtab[hash], ((uintptr_t)o | (u & 1)));
#else
      hash &= newmask;
      /* NOBARRIER: The string table is a GC root. */
      setgcrefr(o->gch.nextgc, newtab[hash]);
      setgcref(newtab[hash], o);
#endif
      o = next;
    }
  }

  /* Free old table and replace with new table. */
  lj_str_freetab(g);
  g->str.tab = newtab;
  g->str.mask = newmask;
}